

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint __thiscall AmpIO::GetReadNumBytes(AmpIO *this)

{
  uint32_t uVar1;
  int local_18;
  uint numQuads;
  uint32_t fver;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 7) {
    local_18 = this->NumEncoders * 4 + 4;
  }
  else if (uVar1 == 7) {
    local_18 = this->NumEncoders * 6 + 4;
  }
  else {
    local_18 = this->NumMotors * 2 + 4 + this->NumEncoders * 5;
  }
  return local_18 << 2;
}

Assistant:

unsigned int AmpIO::GetReadNumBytes() const
{
    uint32_t fver = GetFirmwareVersion();
    unsigned int numQuads;
    if (fver < 7) {
        numQuads = 4 + 4*NumEncoders;
    } else if (fver == 7) {
        numQuads = 4 + 6*NumEncoders;
    }
    else {
        numQuads = 4 + 2*NumMotors + 5*NumEncoders;
    }
    return numQuads * sizeof(quadlet_t);
}